

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndividualBeliefJESP.cpp
# Opt level: O2

string * __thiscall
IndividualBeliefJESP::SoftPrint_abi_cxx11_
          (string *__return_storage_ptr__,IndividualBeliefJESP *this)

{
  pointer puVar1;
  uint uVar2;
  ostream *poVar3;
  pointer puVar4;
  double dVar5;
  stringstream ss;
  stringstream ss_1;
  ulong local_540;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_520;
  string local_508 [32];
  string local_4e8 [32];
  stringstream local_4c8 [16];
  ostream local_4b8 [376];
  stringstream local_340 [16];
  ostream local_330 [376];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_4c8);
  local_540 = 0;
  while( true ) {
    uVar2 = (**(code **)(*(long *)&this->super_Belief + 0x70))();
    if (uVar2 <= local_540) break;
    poVar3 = std::operator<<(local_4b8,"eI=");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,",[sI=");
    GetStateIndex(this,(Index)local_540);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,", ");
    GetOthersObservationHistIndex
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_520,this,
               (Index)local_540);
    std::__cxx11::stringstream::stringstream(local_340);
    puVar1 = local_520._M_impl.super__Vector_impl_data._M_finish;
    puVar4 = local_520._M_impl.super__Vector_impl_data._M_start;
    std::operator<<(local_330,"< ");
    for (; puVar4 != puVar1; puVar4 = puVar4 + 1) {
      if (puVar4 != local_520._M_impl.super__Vector_impl_data._M_start) {
        std::operator<<(local_330,", ");
      }
      std::__cxx11::stringstream::stringstream(local_1b8);
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::operator<<(local_330,local_4e8);
      std::__cxx11::string::~string(local_4e8);
    }
    std::operator<<(local_330," >");
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream(local_340);
    poVar3 = std::operator<<(poVar3,local_508);
    std::operator<<(poVar3," ] - p=");
    dVar5 = (double)(**(code **)(*(long *)&this->super_Belief + 0x48))(this,local_540);
    poVar3 = std::ostream::_M_insert<double>(dVar5);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string(local_508);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_520);
    local_540 = local_540 + 1;
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_4c8);
  return __return_storage_ptr__;
}

Assistant:

string IndividualBeliefJESP::SoftPrint() const
{
    stringstream ss;
    for(Index eI=0; eI < Size(); eI++)
    {
        ss << "eI="<<eI<<",[sI="<<GetStateIndex(eI) << ", " <<
            SoftPrintVector(GetOthersObservationHistIndex(eI)) << " ] - p=" <<
            Get(eI) << endl;
    }
    return (ss.str());
}